

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsing.cpp
# Opt level: O3

void wasm::UniqueNameMapper::uniquify(Expression *curr)

{
  char *pcVar1;
  Expression **ppEVar2;
  TaskFunc p_Var3;
  undefined1 auStack_3a8 [8];
  DuplicateNameScanner scanner;
  Walker walker;
  Expression *curr_local;
  
  auStack_3a8 = (undefined1  [8])0x0;
  scanner.
  super_PostWalker<wasm::(anonymous_namespace)::DuplicateNameScanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::DuplicateNameScanner,_void>_>
  .
  super_Walker<wasm::(anonymous_namespace)::DuplicateNameScanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::DuplicateNameScanner,_void>_>
  .replacep = (Expression **)0x0;
  scanner.
  super_PostWalker<wasm::(anonymous_namespace)::DuplicateNameScanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::DuplicateNameScanner,_void>_>
  .
  super_Walker<wasm::(anonymous_namespace)::DuplicateNameScanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::DuplicateNameScanner,_void>_>
  .stack.fixed._M_elems[9].currp = (Expression **)0x0;
  scanner.
  super_PostWalker<wasm::(anonymous_namespace)::DuplicateNameScanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::DuplicateNameScanner,_void>_>
  .
  super_Walker<wasm::(anonymous_namespace)::DuplicateNameScanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::DuplicateNameScanner,_void>_>
  .stack.flexible.
  super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::DuplicateNameScanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::DuplicateNameScanner,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::DuplicateNameScanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::DuplicateNameScanner,_void>_>::Task>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  scanner.
  super_PostWalker<wasm::(anonymous_namespace)::DuplicateNameScanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::DuplicateNameScanner,_void>_>
  .
  super_Walker<wasm::(anonymous_namespace)::DuplicateNameScanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::DuplicateNameScanner,_void>_>
  .stack.flexible.
  super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::DuplicateNameScanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::DuplicateNameScanner,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::DuplicateNameScanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::DuplicateNameScanner,_void>_>::Task>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  scanner.
  super_PostWalker<wasm::(anonymous_namespace)::DuplicateNameScanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::DuplicateNameScanner,_void>_>
  .
  super_Walker<wasm::(anonymous_namespace)::DuplicateNameScanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::DuplicateNameScanner,_void>_>
  .stack.flexible.
  super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::DuplicateNameScanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::DuplicateNameScanner,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::DuplicateNameScanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::DuplicateNameScanner,_void>_>::Task>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  scanner.
  super_PostWalker<wasm::(anonymous_namespace)::DuplicateNameScanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::DuplicateNameScanner,_void>_>
  .
  super_Walker<wasm::(anonymous_namespace)::DuplicateNameScanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::DuplicateNameScanner,_void>_>
  .currFunction = (Function *)0x0;
  scanner.
  super_PostWalker<wasm::(anonymous_namespace)::DuplicateNameScanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::DuplicateNameScanner,_void>_>
  .
  super_Walker<wasm::(anonymous_namespace)::DuplicateNameScanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::DuplicateNameScanner,_void>_>
  .currModule._0_1_ = '\x01';
  walker.mapper._120_8_ = curr;
  memset(&scanner.ok,0,0xa8);
  scanner.seen.
  super_SmallSetBase<wasm::Name,_10UL,_wasm::UnorderedFixedStorage<wasm::Name,_10UL>,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>_>
  .fixed.super_FixedStorageBase<wasm::Name,_10UL>.storage._M_elems[9].super_IString.str._M_str =
       (char *)&scanner.seen.
                super_SmallSetBase<wasm::Name,_10UL,_wasm::UnorderedFixedStorage<wasm::Name,_10UL>,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>_>
                .flexible._M_h._M_rehash_policy._M_next_resize;
  scanner.seen.
  super_SmallSetBase<wasm::Name,_10UL,_wasm::UnorderedFixedStorage<wasm::Name,_10UL>,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>_>
  .flexible._M_h._M_buckets = (__buckets_ptr)0x1;
  scanner.seen.
  super_SmallSetBase<wasm::Name,_10UL,_wasm::UnorderedFixedStorage<wasm::Name,_10UL>,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>_>
  .flexible._M_h._M_bucket_count = 0;
  scanner.seen.
  super_SmallSetBase<wasm::Name,_10UL,_wasm::UnorderedFixedStorage<wasm::Name,_10UL>,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>_>
  .flexible._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  scanner.seen.
  super_SmallSetBase<wasm::Name,_10UL,_wasm::UnorderedFixedStorage<wasm::Name,_10UL>,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>_>
  .flexible._M_h._M_element_count._0_4_ = 0x3f800000;
  scanner.seen.
  super_SmallSetBase<wasm::Name,_10UL,_wasm::UnorderedFixedStorage<wasm::Name,_10UL>,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>_>
  .flexible._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  scanner.seen.
  super_SmallSetBase<wasm::Name,_10UL,_wasm::UnorderedFixedStorage<wasm::Name,_10UL>,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>_>
  .flexible._M_h._M_rehash_policy._4_4_ = 0;
  scanner.seen.
  super_SmallSetBase<wasm::Name,_10UL,_wasm::UnorderedFixedStorage<wasm::Name,_10UL>,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>_>
  .flexible._M_h._M_rehash_policy._M_next_resize = 0;
  Walker<wasm::(anonymous_namespace)::DuplicateNameScanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::DuplicateNameScanner,_void>_>
  ::pushTask((Walker<wasm::(anonymous_namespace)::DuplicateNameScanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::DuplicateNameScanner,_void>_>
              *)auStack_3a8,
             PostWalker<wasm::(anonymous_namespace)::DuplicateNameScanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::DuplicateNameScanner,_void>_>
             ::scan,(Expression **)&walker.mapper.otherIndex);
  if (((long)scanner.
             super_PostWalker<wasm::(anonymous_namespace)::DuplicateNameScanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::DuplicateNameScanner,_void>_>
             .
             super_Walker<wasm::(anonymous_namespace)::DuplicateNameScanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::DuplicateNameScanner,_void>_>
             .stack.flexible.
             super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::DuplicateNameScanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::DuplicateNameScanner,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::DuplicateNameScanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::DuplicateNameScanner,_void>_>::Task>_>
             ._M_impl.super__Vector_impl_data._M_start -
       (long)scanner.
             super_PostWalker<wasm::(anonymous_namespace)::DuplicateNameScanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::DuplicateNameScanner,_void>_>
             .
             super_Walker<wasm::(anonymous_namespace)::DuplicateNameScanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::DuplicateNameScanner,_void>_>
             .stack.fixed._M_elems[9].currp >> 4) +
      (long)scanner.
            super_PostWalker<wasm::(anonymous_namespace)::DuplicateNameScanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::DuplicateNameScanner,_void>_>
            .
            super_Walker<wasm::(anonymous_namespace)::DuplicateNameScanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::DuplicateNameScanner,_void>_>
            .replacep != 0) {
    do {
      if ((pointer)scanner.
                   super_PostWalker<wasm::(anonymous_namespace)::DuplicateNameScanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::DuplicateNameScanner,_void>_>
                   .
                   super_Walker<wasm::(anonymous_namespace)::DuplicateNameScanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::DuplicateNameScanner,_void>_>
                   .stack.fixed._M_elems[9].currp ==
          scanner.
          super_PostWalker<wasm::(anonymous_namespace)::DuplicateNameScanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::DuplicateNameScanner,_void>_>
          .
          super_Walker<wasm::(anonymous_namespace)::DuplicateNameScanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::DuplicateNameScanner,_void>_>
          .stack.flexible.
          super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::DuplicateNameScanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::DuplicateNameScanner,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::DuplicateNameScanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::DuplicateNameScanner,_void>_>::Task>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        if (scanner.
            super_PostWalker<wasm::(anonymous_namespace)::DuplicateNameScanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::DuplicateNameScanner,_void>_>
            .
            super_Walker<wasm::(anonymous_namespace)::DuplicateNameScanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::DuplicateNameScanner,_void>_>
            .replacep == (Expression **)0x0) {
          pcVar1 = 
          "T &wasm::SmallVector<wasm::Walker<wasm::(anonymous namespace)::DuplicateNameScanner, wasm::UnifiedExpressionVisitor<wasm::(anonymous namespace)::DuplicateNameScanner>>::Task, 10>::back() [T = wasm::Walker<wasm::(anonymous namespace)::DuplicateNameScanner, wasm::UnifiedExpressionVisitor<wasm::(anonymous namespace)::DuplicateNameScanner>>::Task, N = 10]"
          ;
          goto LAB_00c4cc76;
        }
        ppEVar2 = scanner.
                  super_PostWalker<wasm::(anonymous_namespace)::DuplicateNameScanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::DuplicateNameScanner,_void>_>
                  .
                  super_Walker<wasm::(anonymous_namespace)::DuplicateNameScanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::DuplicateNameScanner,_void>_>
                  .stack.fixed._M_elems
                  [(long)scanner.
                         super_PostWalker<wasm::(anonymous_namespace)::DuplicateNameScanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::DuplicateNameScanner,_void>_>
                         .
                         super_Walker<wasm::(anonymous_namespace)::DuplicateNameScanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::DuplicateNameScanner,_void>_>
                         .replacep + -2].currp;
        auStack_3a8 = (undefined1  [8])
                      scanner.
                      super_PostWalker<wasm::(anonymous_namespace)::DuplicateNameScanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::DuplicateNameScanner,_void>_>
                      .
                      super_Walker<wasm::(anonymous_namespace)::DuplicateNameScanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::DuplicateNameScanner,_void>_>
                      .stack.fixed._M_elems
                      [(long)scanner.
                             super_PostWalker<wasm::(anonymous_namespace)::DuplicateNameScanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::DuplicateNameScanner,_void>_>
                             .
                             super_Walker<wasm::(anonymous_namespace)::DuplicateNameScanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::DuplicateNameScanner,_void>_>
                             .replacep + -1].func;
        scanner.
        super_PostWalker<wasm::(anonymous_namespace)::DuplicateNameScanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::DuplicateNameScanner,_void>_>
        .
        super_Walker<wasm::(anonymous_namespace)::DuplicateNameScanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::DuplicateNameScanner,_void>_>
        .replacep = (Expression **)
                    ((long)scanner.
                           super_PostWalker<wasm::(anonymous_namespace)::DuplicateNameScanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::DuplicateNameScanner,_void>_>
                           .
                           super_Walker<wasm::(anonymous_namespace)::DuplicateNameScanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::DuplicateNameScanner,_void>_>
                           .replacep + -1);
      }
      else {
        ppEVar2 = (Expression **)
                  scanner.
                  super_PostWalker<wasm::(anonymous_namespace)::DuplicateNameScanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::DuplicateNameScanner,_void>_>
                  .
                  super_Walker<wasm::(anonymous_namespace)::DuplicateNameScanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::DuplicateNameScanner,_void>_>
                  .stack.flexible.
                  super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::DuplicateNameScanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::DuplicateNameScanner,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::DuplicateNameScanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::DuplicateNameScanner,_void>_>::Task>_>
                  ._M_impl.super__Vector_impl_data._M_start[-1].func;
        auStack_3a8 = (undefined1  [8])
                      scanner.
                      super_PostWalker<wasm::(anonymous_namespace)::DuplicateNameScanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::DuplicateNameScanner,_void>_>
                      .
                      super_Walker<wasm::(anonymous_namespace)::DuplicateNameScanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::DuplicateNameScanner,_void>_>
                      .stack.flexible.
                      super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::DuplicateNameScanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::DuplicateNameScanner,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::DuplicateNameScanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::DuplicateNameScanner,_void>_>::Task>_>
                      ._M_impl.super__Vector_impl_data._M_start[-1].currp;
        scanner.
        super_PostWalker<wasm::(anonymous_namespace)::DuplicateNameScanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::DuplicateNameScanner,_void>_>
        .
        super_Walker<wasm::(anonymous_namespace)::DuplicateNameScanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::DuplicateNameScanner,_void>_>
        .stack.flexible.
        super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::DuplicateNameScanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::DuplicateNameScanner,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::DuplicateNameScanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::DuplicateNameScanner,_void>_>::Task>_>
        ._M_impl.super__Vector_impl_data._M_start =
             scanner.
             super_PostWalker<wasm::(anonymous_namespace)::DuplicateNameScanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::DuplicateNameScanner,_void>_>
             .
             super_Walker<wasm::(anonymous_namespace)::DuplicateNameScanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::DuplicateNameScanner,_void>_>
             .stack.flexible.
             super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::DuplicateNameScanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::DuplicateNameScanner,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::DuplicateNameScanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::DuplicateNameScanner,_void>_>::Task>_>
             ._M_impl.super__Vector_impl_data._M_start + -1;
      }
      if (*(Expression **)auStack_3a8 == (Expression *)0x0) {
        pcVar1 = 
        "void wasm::Walker<wasm::(anonymous namespace)::DuplicateNameScanner, wasm::UnifiedExpressionVisitor<wasm::(anonymous namespace)::DuplicateNameScanner>>::walk(Expression *&) [SubType = wasm::(anonymous namespace)::DuplicateNameScanner, VisitorType = wasm::UnifiedExpressionVisitor<wasm::(anonymous namespace)::DuplicateNameScanner>]"
        ;
        goto LAB_00c4cc40;
      }
      (*(code *)ppEVar2)((DuplicateNameScanner *)auStack_3a8,(Expression **)auStack_3a8);
    } while (((long)scanner.
                    super_PostWalker<wasm::(anonymous_namespace)::DuplicateNameScanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::DuplicateNameScanner,_void>_>
                    .
                    super_Walker<wasm::(anonymous_namespace)::DuplicateNameScanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::DuplicateNameScanner,_void>_>
                    .stack.flexible.
                    super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::DuplicateNameScanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::DuplicateNameScanner,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::DuplicateNameScanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::DuplicateNameScanner,_void>_>::Task>_>
                    ._M_impl.super__Vector_impl_data._M_start -
              (long)scanner.
                    super_PostWalker<wasm::(anonymous_namespace)::DuplicateNameScanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::DuplicateNameScanner,_void>_>
                    .
                    super_Walker<wasm::(anonymous_namespace)::DuplicateNameScanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::DuplicateNameScanner,_void>_>
                    .stack.fixed._M_elems[9].currp >> 4) +
             (long)scanner.
                   super_PostWalker<wasm::(anonymous_namespace)::DuplicateNameScanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::DuplicateNameScanner,_void>_>
                   .
                   super_Walker<wasm::(anonymous_namespace)::DuplicateNameScanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::DuplicateNameScanner,_void>_>
                   .replacep != 0);
  }
  if ((char)scanner.
            super_PostWalker<wasm::(anonymous_namespace)::DuplicateNameScanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::DuplicateNameScanner,_void>_>
            .
            super_Walker<wasm::(anonymous_namespace)::DuplicateNameScanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::DuplicateNameScanner,_void>_>
            .currModule == '\0') {
    walker.mapper.labelMappings._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)&walker.mapper.labelMappings;
    scanner.seen.
    super_SmallSetBase<wasm::Name,_10UL,_wasm::UnorderedFixedStorage<wasm::Name,_10UL>,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>_>
    .flexible._M_h._M_single_bucket = (__node_base_ptr)0x0;
    walker.super_ControlFlowWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
    super_PostWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
    super_Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.replacep =
         (Expression **)0x0;
    walker.super_ControlFlowWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
    super_PostWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
    super_Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.stack.fixed._M_elems[9].
    currp = (Expression **)0x0;
    walker.super_ControlFlowWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
    super_PostWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
    super_Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.stack.flexible.
    super__Vector_base<wasm::Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>::Task,_std::allocator<wasm::Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>::Task>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    walker.super_ControlFlowWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
    super_PostWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
    super_Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.stack.flexible.
    super__Vector_base<wasm::Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>::Task,_std::allocator<wasm::Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>::Task>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    walker.super_ControlFlowWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
    super_PostWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
    super_Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.stack.flexible.
    super__Vector_base<wasm::Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>::Task,_std::allocator<wasm::Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>::Task>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    walker.super_ControlFlowWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
    super_PostWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
    super_Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.currFunction =
         (Function *)0x0;
    walker.super_ControlFlowWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
    super_PostWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
    super_Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.currModule = (Module *)0x0;
    walker.mapper.labelMappings._M_t._M_impl._0_4_ = 0;
    walker.mapper.labelMappings._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    walker.mapper.labelMappings._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    walker.super_ControlFlowWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
    controlFlowStack.fixed._M_elems[9] = (Expression *)0x0;
    walker.super_ControlFlowWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
    controlFlowStack.flexible.
    super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    walker.super_ControlFlowWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
    controlFlowStack.flexible.
    super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    walker.super_ControlFlowWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
    controlFlowStack.flexible.
    super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    walker.mapper.labelStack.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    walker.mapper.labelStack.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    walker.mapper.labelMappings._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         (_Base_ptr)0x0;
    walker.mapper.reverseLabelMapping._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)&walker.mapper.reverseLabelMapping;
    walker.mapper.reverseLabelMapping._M_t._M_impl._0_4_ = 0;
    walker.mapper.reverseLabelMapping._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red
    ;
    walker.mapper.reverseLabelMapping._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    walker.mapper.reverseLabelMapping._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         (_Base_ptr)0x0;
    walker.mapper.reverseLabelMapping._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ = 0;
    walker.mapper.labelMappings._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         walker.mapper.labelMappings._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    walker.mapper.reverseLabelMapping._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         walker.mapper.reverseLabelMapping._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>::pushTask
              ((Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_> *)
               &scanner.seen.
                super_SmallSetBase<wasm::Name,_10UL,_wasm::UnorderedFixedStorage<wasm::Name,_10UL>,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>_>
                .flexible._M_h._M_single_bucket,
               ControlFlowWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>::scan,
               (Expression **)&walker.mapper.otherIndex);
    if (((long)walker.super_ControlFlowWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>
               .super_PostWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
               super_Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.stack.flexible.
               super__Vector_base<wasm::Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>::Task,_std::allocator<wasm::Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>::Task>_>
               ._M_impl.super__Vector_impl_data._M_start -
         (long)walker.super_ControlFlowWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>
               .super_PostWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
               super_Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.stack.fixed.
               _M_elems[9].currp >> 4) +
        (long)walker.super_ControlFlowWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
              super_PostWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
              super_Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.replacep != 0) {
      do {
        if ((pointer)walker.
                     super_ControlFlowWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
                     super_PostWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
                     super_Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.stack.fixed
                     ._M_elems[9].currp ==
            walker.super_ControlFlowWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
            super_PostWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
            super_Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.stack.flexible.
            super__Vector_base<wasm::Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>::Task,_std::allocator<wasm::Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>::Task>_>
            ._M_impl.super__Vector_impl_data._M_start) {
          if (walker.super_ControlFlowWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
              super_PostWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
              super_Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.replacep ==
              (Expression **)0x0) {
            pcVar1 = 
            "T &wasm::SmallVector<wasm::Walker<Walker, wasm::UnifiedExpressionVisitor<Walker>>::Task, 10>::back() [T = wasm::Walker<Walker, wasm::UnifiedExpressionVisitor<Walker>>::Task, N = 10]"
            ;
LAB_00c4cc76:
            __assert_fail("usedFixed > 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/support/small_vector.h"
                          ,0x7e,pcVar1);
          }
          p_Var3 = *(TaskFunc *)
                    ((long)(&walker.
                             super_ControlFlowWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>
                             .
                             super_PostWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>
                             .super_Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
                             stack.fixed + -1) + 0x88 +
                    (long)walker.
                          super_ControlFlowWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>
                          .super_PostWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
                          super_Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
                          replacep * 0x10);
          scanner.seen.
          super_SmallSetBase<wasm::Name,_10UL,_wasm::UnorderedFixedStorage<wasm::Name,_10UL>,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>_>
          .flexible._M_h._M_single_bucket =
               *(__node_base_ptr *)
                ((long)(&walker.
                         super_ControlFlowWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>
                         .super_PostWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
                         super_Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.stack.
                         fixed + -1) + 0x90 +
                (long)walker.
                      super_ControlFlowWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>
                      .super_PostWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
                      super_Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.replacep *
                0x10);
          walker.super_ControlFlowWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
          super_PostWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
          super_Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.replacep =
               (Expression **)
               ((long)walker.
                      super_ControlFlowWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>
                      .super_PostWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
                      super_Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.replacep +
               -1);
        }
        else {
          p_Var3 = walker.
                   super_ControlFlowWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
                   super_PostWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
                   super_Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.stack.
                   flexible.
                   super__Vector_base<wasm::Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>::Task,_std::allocator<wasm::Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>::Task>_>
                   ._M_impl.super__Vector_impl_data._M_start[-1].func;
          scanner.seen.
          super_SmallSetBase<wasm::Name,_10UL,_wasm::UnorderedFixedStorage<wasm::Name,_10UL>,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>_>
          .flexible._M_h._M_single_bucket =
               (__node_base_ptr)
               walker.super_ControlFlowWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>
               .super_PostWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
               super_Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.stack.flexible.
               super__Vector_base<wasm::Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>::Task,_std::allocator<wasm::Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>::Task>_>
               ._M_impl.super__Vector_impl_data._M_start[-1].currp;
          walker.super_ControlFlowWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
          super_PostWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
          super_Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.stack.flexible.
          super__Vector_base<wasm::Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>::Task,_std::allocator<wasm::Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>::Task>_>
          ._M_impl.super__Vector_impl_data._M_start =
               walker.super_ControlFlowWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>
               .super_PostWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
               super_Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.stack.flexible.
               super__Vector_base<wasm::Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>::Task,_std::allocator<wasm::Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>::Task>_>
               ._M_impl.super__Vector_impl_data._M_start + -1;
        }
        if ((Expression *)
            (scanner.seen.
             super_SmallSetBase<wasm::Name,_10UL,_wasm::UnorderedFixedStorage<wasm::Name,_10UL>,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>_>
             .flexible._M_h._M_single_bucket)->_M_nxt == (Expression *)0x0) {
          pcVar1 = 
          "void wasm::Walker<Walker, wasm::UnifiedExpressionVisitor<Walker>>::walk(Expression *&) [SubType = Walker, VisitorType = wasm::UnifiedExpressionVisitor<Walker>]"
          ;
LAB_00c4cc40:
          __assert_fail("*task.currp",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-traversal.h"
                        ,0x132,pcVar1);
        }
        (*p_Var3)((Walker *)
                  &scanner.seen.
                   super_SmallSetBase<wasm::Name,_10UL,_wasm::UnorderedFixedStorage<wasm::Name,_10UL>,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>_>
                   .flexible._M_h._M_single_bucket,
                  (Expression **)
                  scanner.seen.
                  super_SmallSetBase<wasm::Name,_10UL,_wasm::UnorderedFixedStorage<wasm::Name,_10UL>,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>_>
                  .flexible._M_h._M_single_bucket);
      } while (((long)walker.
                      super_ControlFlowWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>
                      .super_PostWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
                      super_Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.stack.
                      flexible.
                      super__Vector_base<wasm::Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>::Task,_std::allocator<wasm::Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>::Task>_>
                      ._M_impl.super__Vector_impl_data._M_start -
                (long)walker.
                      super_ControlFlowWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>
                      .super_PostWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
                      super_Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.stack.
                      fixed._M_elems[9].currp >> 4) +
               (long)walker.
                     super_ControlFlowWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
                     super_PostWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
                     super_Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.replacep !=
               0);
    }
    std::
    _Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::_Select1st<std::pair<const_wasm::Name,_wasm::Name>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
    ::~_Rb_tree((_Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::_Select1st<std::pair<const_wasm::Name,_wasm::Name>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
                 *)&walker.mapper.labelMappings._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::
    _Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>,_std::_Select1st<std::pair<const_wasm::Name,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>,_std::_Select1st<std::pair<const_wasm::Name,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>_>_>
                 *)&walker.mapper.labelStack.
                    super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
    if (walker.super_ControlFlowWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
        controlFlowStack.flexible.
        super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
      operator_delete(walker.
                      super_ControlFlowWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>
                      .controlFlowStack.flexible.
                      super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage,
                      (long)walker.mapper.labelStack.
                            super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)walker.
                            super_ControlFlowWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>
                            .controlFlowStack.flexible.
                            super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
    }
    if (walker.super_ControlFlowWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
        controlFlowStack.fixed._M_elems[9] != (Expression *)0x0) {
      operator_delete(walker.
                      super_ControlFlowWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>
                      .controlFlowStack.fixed._M_elems[9],
                      (long)walker.
                            super_ControlFlowWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>
                            .controlFlowStack.flexible.
                            super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)walker.
                            super_ControlFlowWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>
                            .controlFlowStack.fixed._M_elems[9]);
    }
    if (walker.super_ControlFlowWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
        super_PostWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
        super_Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.stack.fixed._M_elems[9].
        currp != (Expression **)0x0) {
      operator_delete(walker.
                      super_ControlFlowWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>
                      .super_PostWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
                      super_Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.stack.
                      fixed._M_elems[9].currp,
                      (long)walker.
                            super_ControlFlowWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>
                            .super_PostWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>
                            .super_Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
                            stack.flexible.
                            super__Vector_base<wasm::Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>::Task,_std::allocator<wasm::Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>::Task>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)walker.
                            super_ControlFlowWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>
                            .super_PostWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>
                            .super_Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
                            stack.fixed._M_elems[9].currp);
    }
  }
  std::
  _Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable((_Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 *)&scanner.seen.
                    super_SmallSetBase<wasm::Name,_10UL,_wasm::UnorderedFixedStorage<wasm::Name,_10UL>,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>_>
                    .fixed.super_FixedStorageBase<wasm::Name,_10UL>.storage._M_elems[9].
                    super_IString.str._M_str);
  if (scanner.
      super_PostWalker<wasm::(anonymous_namespace)::DuplicateNameScanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::DuplicateNameScanner,_void>_>
      .
      super_Walker<wasm::(anonymous_namespace)::DuplicateNameScanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::DuplicateNameScanner,_void>_>
      .stack.fixed._M_elems[9].currp != (Expression **)0x0) {
    operator_delete(scanner.
                    super_PostWalker<wasm::(anonymous_namespace)::DuplicateNameScanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::DuplicateNameScanner,_void>_>
                    .
                    super_Walker<wasm::(anonymous_namespace)::DuplicateNameScanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::DuplicateNameScanner,_void>_>
                    .stack.fixed._M_elems[9].currp,
                    (long)scanner.
                          super_PostWalker<wasm::(anonymous_namespace)::DuplicateNameScanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::DuplicateNameScanner,_void>_>
                          .
                          super_Walker<wasm::(anonymous_namespace)::DuplicateNameScanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::DuplicateNameScanner,_void>_>
                          .stack.flexible.
                          super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::DuplicateNameScanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::DuplicateNameScanner,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::DuplicateNameScanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::DuplicateNameScanner,_void>_>::Task>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)scanner.
                          super_PostWalker<wasm::(anonymous_namespace)::DuplicateNameScanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::DuplicateNameScanner,_void>_>
                          .
                          super_Walker<wasm::(anonymous_namespace)::DuplicateNameScanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::DuplicateNameScanner,_void>_>
                          .stack.fixed._M_elems[9].currp);
  }
  return;
}

Assistant:

void UniqueNameMapper::uniquify(Expression* curr) {
  // First, scan the code to see if anything needs to be fixed up, since in the
  // common case nothing needs fixing, and we can verify that very quickly.
  DuplicateNameScanner scanner;
  scanner.walk(curr);
  if (scanner.ok) {
    return;
  }

  struct Walker
    : public ControlFlowWalker<Walker, UnifiedExpressionVisitor<Walker>> {
    UniqueNameMapper mapper;

    static void doPreVisitControlFlow(Walker* self, Expression** currp) {
      BranchUtils::operateOnScopeNameDefs(*currp, [&](Name& name) {
        if (name.is()) {
          name = self->mapper.pushLabelName(name);
        }
      });
    }

    static void doPostVisitControlFlow(Walker* self, Expression** currp) {
      BranchUtils::operateOnScopeNameDefs(*currp, [&](Name& name) {
        if (name.is()) {
          self->mapper.popLabelName(name);
        }
      });
    }

    void visitExpression(Expression* curr) {
      BranchUtils::operateOnScopeNameUses(curr, [&](Name& name) {
        if (name.is()) {
          name = mapper.sourceToUnique(name);
        }
      });
    }
  } walker;

  walker.walk(curr);
}